

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  FILE *__stream_00;
  int c;
  LoadF lf;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  if (filename == (char *)0x0) {
    lua_pushstring(L,"=stdin");
    __stream_00 = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    piVar5 = __errno_location();
    *piVar5 = 0;
    lf.f = (FILE *)fopen64(filename,"r");
    __stream_00 = (FILE *)lf.f;
    if ((FILE *)lf.f == (FILE *)0x0) {
      pcVar6 = "open";
      goto LAB_00138d50;
    }
  }
  lf.n = 0;
  lf.f = (FILE *)__stream_00;
  iVar2 = skipcomment((FILE *)__stream_00,&c);
  if (iVar2 != 0) {
    lf.n = 1;
    lf.buff[0] = '\n';
  }
  uVar3 = (uint)(iVar2 != 0);
  if (c == 0x1b) {
    lf.n = 0;
    if (filename != (char *)0x0) {
      piVar5 = __errno_location();
      *piVar5 = 0;
      lf.f = (FILE *)freopen64(filename,"rb",__stream_00);
      if ((FILE *)lf.f == (FILE *)0x0) {
        pcVar6 = "reopen";
        goto LAB_00138d50;
      }
      skipcomment(lf.f,&c);
      uVar3 = 0;
      goto LAB_00138ccf;
    }
    uVar3 = 0;
    c = 0x1b;
LAB_00138cdb:
    lf.n = uVar3 + 1;
    lf.buff[uVar3] = (char)c;
  }
  else {
LAB_00138ccf:
    if (c != -1) goto LAB_00138cdb;
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar2 = lua_load(L,getF,&lf,pcVar6,mode);
  __stream = lf.f;
  iVar4 = ferror((FILE *)lf.f);
  if (filename != (char *)0x0) {
    fclose((FILE *)__stream);
  }
  if (iVar4 == 0) {
    lua_rotate(L,iVar1,-1);
    lua_settop(L,-2);
    return iVar2;
  }
  lua_settop(L,iVar1);
  pcVar6 = "read";
LAB_00138d50:
  errfile(L,pcVar6,iVar1);
  return 6;
}

Assistant:

LUALIB_API int luaL_loadfilex (lua_State *L, const char *filename,
                                             const char *mode) {
  LoadF lf;
  int status, readstatus;
  int c;
  int fnameindex = lua_gettop(L) + 1;  /* index of filename on the stack */
  if (filename == NULL) {
    lua_pushliteral(L, "=stdin");
    lf.f = stdin;
  }
  else {
    lua_pushfstring(L, "@%s", filename);
    errno = 0;
    lf.f = fopen(filename, "r");
    if (lf.f == NULL) return errfile(L, "open", fnameindex);
  }
  lf.n = 0;
  if (skipcomment(lf.f, &c))  /* read initial portion */
    lf.buff[lf.n++] = '\n';  /* add newline to correct line numbers */
  if (c == LUA_SIGNATURE[0]) {  /* binary file? */
    lf.n = 0;  /* remove possible newline */
    if (filename) {  /* "real" file? */
      errno = 0;
      lf.f = freopen(filename, "rb", lf.f);  /* reopen in binary mode */
      if (lf.f == NULL) return errfile(L, "reopen", fnameindex);
      skipcomment(lf.f, &c);  /* re-read initial portion */
    }
  }
  if (c != EOF)
    lf.buff[lf.n++] = c;  /* 'c' is the first character of the stream */
  errno = 0;
  status = lua_load(L, getF, &lf, lua_tostring(L, -1), mode);
  readstatus = ferror(lf.f);
  if (filename) fclose(lf.f);  /* close file (even in case of errors) */
  if (readstatus) {
    lua_settop(L, fnameindex);  /* ignore results from 'lua_load' */
    return errfile(L, "read", fnameindex);
  }
  lua_remove(L, fnameindex);
  return status;
}